

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_char_array_struct_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               size_t count)

{
  char *pcVar1;
  size_t len_local;
  char *name_local;
  size_t offset_local;
  void *p_local;
  int index_local;
  flatcc_json_printer_t *ctx_local;
  
  if (index != 0) {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = ',';
  }
  print_name(ctx,name,len);
  print_char_array(ctx,(char *)((long)p + offset),count);
  return;
}

Assistant:

void flatcc_json_printer_char_array_struct_field(
        flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len, size_t count)
{
    p = (void *)((size_t)p + offset);
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_char_array(ctx, p, count);
}